

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O0

FT_Module_Interface af_get_interface(FT_Module module,char *module_interface)

{
  FT_Pointer pvVar1;
  char *module_interface_local;
  FT_Module module_local;
  
  pvVar1 = ft_service_list_lookup(af_services,module_interface);
  return pvVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_Module_Interface )
  af_get_interface( FT_Module    module,
                    const char*  module_interface )
  {
    /* AF_SERVICES_GET dereferences `library' in PIC mode */
#ifdef FT_CONFIG_OPTION_PIC
    FT_Library  library;


    if ( !module )
      return NULL;
    library = module->library;
    if ( !library )
      return NULL;
#else
    FT_UNUSED( module );
#endif

    return ft_service_list_lookup( AF_SERVICES_GET, module_interface );
  }